

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

double __thiscall MultivariateTracker::getCovariance(MultivariateTracker *this,long i,long j)

{
  int iVar1;
  size_type sVar2;
  runtime_error *this_00;
  const_reference pvVar3;
  int k;
  int numPoints;
  long j_local;
  long i_local;
  MultivariateTracker *this_local;
  
  sVar2 = std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::size
                    (&this->_statistics);
  iVar1 = (int)sVar2;
  if ((((-1 < i) && (i < iVar1)) && (-1 < j)) && (j < iVar1)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       (&this->_covariance,(long)((int)i * iVar1 + (int)j));
    return *pvVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid covariance indices");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double
    getCovariance(long const i,
                  long const j) const
    {
        const int numPoints = this->_statistics.size();
        if ((i < 0) || (i >= numPoints) || (j < 0) || (j >= numPoints)) throw std::runtime_error("Invalid covariance indices");
        int k = i * numPoints + j;
        return this->_covariance.at(k);
    }